

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O0

bool __thiscall DataRefs::NeedNewVerCheck(DataRefs *this)

{
  rep rVar1;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_RDI;
  int nowH;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  rep local_28;
  duration<long,_std::ratio<3600L,_1L>_> local_20 [3];
  bool local_1;
  
  if ((int)in_RDI[0xe4].__r == 0) {
    local_1 = true;
  }
  else {
    local_30.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_28 = (rep)std::chrono::
                    time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    ::time_since_epoch(&local_30);
    local_20[0].__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<3600l,1l>>,long,std::ratio<1l,1000000000l>>
                        (in_RDI);
    rVar1 = std::chrono::duration<long,_std::ratio<3600L,_1L>_>::count(local_20);
    local_1 = 0x30 < (int)rVar1 - (int)in_RDI[0xe4].__r;
  }
  return local_1;
}

Assistant:

bool DataRefs::NeedNewVerCheck () const
{
    if (!lastCheckNewVer)
        return true;
    
    // 'now' in hours since the epoch
    int nowH = (int)std::chrono::duration_cast<std::chrono::hours>
    (std::chrono::system_clock::now().time_since_epoch()).count();
    
    return nowH - lastCheckNewVer > LT_NEW_VER_CHECK_TIME;
}